

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O3

string * __thiscall
OpenMD::containerToString<std::vector<double,std::allocator<double>>>
          (string *__return_storage_ptr__,OpenMD *this,vector<double,_std::allocator<double>_> *cont
          )

{
  double *pdVar1;
  ostringstream oss;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
  pdVar1 = *(double **)this;
  if (pdVar1 != *(double **)(this + 8)) {
    std::ostream::_M_insert<double>(*pdVar1);
    pdVar1 = pdVar1 + 1;
    if (pdVar1 != *(double **)(this + 8)) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", ",2);
        std::ostream::_M_insert<double>(*pdVar1);
        pdVar1 = pdVar1 + 1;
      } while (pdVar1 != *(double **)(this + 8));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string containerToString(const ContainerType& cont) {
    std::ostringstream oss;
    oss << "(";
    typename ContainerType::const_iterator i = cont.begin();
    if (i != cont.end()) {
      oss << *i;
      ++i;
    }
    for (; i != cont.end(); ++i) {
      oss << ", ";
      oss << *i;
    }
    oss << ")";
    return oss.str();
  }